

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfSkin(Skin *skin,json *o)

{
  long lVar1;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  Skin *skin_local;
  
  local_18 = o;
  o_local = (json *)skin;
  if (skin->inverseBindMatrices != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"inverseBindMatrices",&local_39);
    SerializeNumberProperty<int>(&local_38,*(int *)(o_local + 2),local_18);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"joints",&local_71);
  SerializeNumberArrayProperty<int>
            (&local_70,(vector<int,_std::allocator<int>_> *)&o_local[2].m_value,local_18);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"skeleton",&local_99);
  SerializeNumberProperty<int>(&local_98,*(int *)&o_local[2].field_0x4,local_18);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"name",&local_c1);
    SerializeStringProperty(&local_c0,(string *)o_local,local_18);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  return;
}

Assistant:

static void SerializeGltfSkin(Skin &skin, json &o) {
  if (skin.inverseBindMatrices != -1)
    SerializeNumberProperty("inverseBindMatrices", skin.inverseBindMatrices, o);

  SerializeNumberArrayProperty<int>("joints", skin.joints, o);
  SerializeNumberProperty("skeleton", skin.skeleton, o);
  if (skin.name.size()) {
    SerializeStringProperty("name", skin.name, o);
  }
}